

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderIndexingTests.cpp
# Opt level: O2

void deqp::evalSubscriptMat4(ShaderEvalContext *c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [12];
  Vector<float,_4> local_b8;
  Vector<float,_4> local_a8;
  Vector<float,_4> local_98;
  tcu local_80 [16];
  tcu local_70 [16];
  tcu local_60 [16];
  tcu local_50 [16];
  tcu local_40 [16];
  undefined8 local_30;
  undefined8 uStack_28;
  
  auVar1 = *(undefined1 (*) [16])(c->coords).m_data;
  auVar2 = auVar1._4_12_;
  local_98.m_data[3] = auVar1._0_4_;
  local_98.m_data[0] = (float)auVar2._0_4_;
  local_98.m_data[1] = (float)auVar2._4_4_;
  local_98.m_data[2] = (float)auVar2._8_4_;
  tcu::operator*(local_60,0.5,&local_98);
  tcu::operator+(local_50,&c->coords,(Vector<float,_4> *)local_60);
  auVar1 = *(undefined1 (*) [16])(c->coords).m_data;
  local_a8.m_data[2] = (float)auVar1._0_4_;
  local_a8.m_data[0] = (float)(int)auVar1._8_8_;
  local_a8.m_data[1] = (float)(int)((ulong)auVar1._8_8_ >> 0x20);
  local_a8.m_data[3] = auVar1._4_4_;
  tcu::operator*(local_70,0.25,&local_a8);
  tcu::operator+(local_40,(Vector<float,_4> *)local_50,(Vector<float,_4> *)local_70);
  local_b8.m_data[1] = (c->coords).m_data[0];
  local_b8.m_data[2] = (c->coords).m_data[1];
  local_b8.m_data[3] = (c->coords).m_data[2];
  local_b8.m_data[0] = (c->coords).m_data[3];
  tcu::operator*(local_80,0.125,&local_b8);
  tcu::operator+((tcu *)&local_30,(Vector<float,_4> *)local_40,(Vector<float,_4> *)local_80);
  *(undefined8 *)(c->color).m_data = local_30;
  *(undefined8 *)((c->color).m_data + 2) = uStack_28;
  return;
}

Assistant:

void evalSubscriptMat4(ShaderEvalContext& c)
{
	c.color = c.coords + 0.5f * c.coords.swizzle(1, 2, 3, 0) + 0.25f * c.coords.swizzle(2, 3, 0, 1) +
			  0.125f * c.coords.swizzle(3, 0, 1, 2);
}